

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

void d68040_fpu(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  uint local_bc;
  char local_b8 [4];
  int i_1;
  char temp_1 [32];
  uint local_8c;
  char local_88 [4];
  int i;
  char temp [32];
  uint dst_reg;
  uint src;
  uint w2;
  char mnemonic [40];
  char float_data_format [8] [3];
  
  float_data_format[0][0] = '\0';
  float_data_format[0][1] = '.';
  float_data_format[0][2] = 'p';
  float_data_format[1][0] = '\0';
  float_data_format[1][1] = '.';
  float_data_format[1][2] = 'w';
  float_data_format[2][0] = '\0';
  float_data_format[2][1] = '.';
  float_data_format[2][2] = 'd';
  float_data_format[3][0] = '\0';
  float_data_format[3][1] = '.';
  float_data_format[3][2] = 'b';
  float_data_format[4][0] = '\0';
  float_data_format[4][1] = '.';
  float_data_format[4][2] = 'p';
  float_data_format[5][0] = '\0';
  if ((g_cpu_type & 0x18) == 0) {
    if ((g_cpu_ir & 0xf000) == 0xf000) {
      d68000_1111();
    }
    else {
      d68000_illegal();
    }
  }
  else {
    uVar1 = dasm_read_imm_16(2);
    uVar2 = uVar1 >> 10 & 7;
    uVar3 = uVar1 >> 7 & 7;
    temp._28_4_ = uVar3;
    if (((uVar1 >> 0xd & 7) == 2) && ((uVar1 >> 10 & 7) == 7)) {
      sprintf(g_dasm_str,"fmovecr   #$%0x, fp%d",(ulong)(uVar1 & 0x7f),(ulong)uVar3);
    }
    else {
      switch(uVar1 >> 0xd & 7) {
      case 0:
      case 2:
        switch(uVar1 & 0x7f) {
        case 0:
          sprintf((char *)&src,"fmove");
          break;
        case 1:
          sprintf((char *)&src,"fint");
          break;
        case 2:
          sprintf((char *)&src,"fsinh");
          break;
        case 3:
          sprintf((char *)&src,"fintrz");
          break;
        case 4:
          sprintf((char *)&src,"fsqrt");
          break;
        default:
          sprintf((char *)&src,"FPU (?)");
          break;
        case 6:
          sprintf((char *)&src,"flognp1");
          break;
        case 8:
          sprintf((char *)&src,"fetoxm1");
          break;
        case 9:
          sprintf((char *)&src,"ftanh1");
          break;
        case 10:
          sprintf((char *)&src,"fatan");
          break;
        case 0xc:
          sprintf((char *)&src,"fasin");
          break;
        case 0xd:
          sprintf((char *)&src,"fatanh");
          break;
        case 0xe:
          sprintf((char *)&src,"fsin");
          break;
        case 0xf:
          sprintf((char *)&src,"ftan");
          break;
        case 0x10:
          sprintf((char *)&src,"fetox");
          break;
        case 0x11:
          sprintf((char *)&src,"ftwotox");
          break;
        case 0x12:
          sprintf((char *)&src,"ftentox");
          break;
        case 0x14:
          sprintf((char *)&src,"flogn");
          break;
        case 0x15:
          sprintf((char *)&src,"flog10");
          break;
        case 0x16:
          sprintf((char *)&src,"flog2");
          break;
        case 0x18:
          sprintf((char *)&src,"fabs");
          break;
        case 0x19:
          sprintf((char *)&src,"fcosh");
          break;
        case 0x1a:
          sprintf((char *)&src,"fneg");
          break;
        case 0x1c:
          sprintf((char *)&src,"facos");
          break;
        case 0x1d:
          sprintf((char *)&src,"fcos");
          break;
        case 0x1e:
          sprintf((char *)&src,"fgetexp");
          break;
        case 0x1f:
          sprintf((char *)&src,"fgetman");
          break;
        case 0x20:
          sprintf((char *)&src,"fdiv");
          break;
        case 0x21:
          sprintf((char *)&src,"fmod");
          break;
        case 0x22:
          sprintf((char *)&src,"fadd");
          break;
        case 0x23:
          sprintf((char *)&src,"fmul");
          break;
        case 0x24:
          sprintf((char *)&src,"fsgldiv");
          break;
        case 0x25:
          sprintf((char *)&src,"frem");
          break;
        case 0x26:
          sprintf((char *)&src,"fscale");
          break;
        case 0x27:
          sprintf((char *)&src,"fsglmul");
          break;
        case 0x28:
          sprintf((char *)&src,"fsub");
          break;
        case 0x30:
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
          sprintf((char *)&src,"fsincos");
          break;
        case 0x38:
          sprintf((char *)&src,"fcmp");
          break;
        case 0x3a:
          sprintf((char *)&src,"ftst");
          break;
        case 0x41:
          sprintf((char *)&src,"fssqrt");
          break;
        case 0x45:
          sprintf((char *)&src,"fdsqrt");
          break;
        case 0x58:
          sprintf((char *)&src,"fsabs");
          break;
        case 0x5a:
          sprintf((char *)&src,"fsneg");
          break;
        case 0x5c:
          sprintf((char *)&src,"fdabs");
          break;
        case 0x5e:
          sprintf((char *)&src,"fdneg");
          break;
        case 0x60:
          sprintf((char *)&src,"fsdiv");
          break;
        case 0x62:
          sprintf((char *)&src,"fsadd");
          break;
        case 99:
          sprintf((char *)&src,"fsmul");
          break;
        case 100:
          sprintf((char *)&src,"fddiv");
          break;
        case 0x66:
          sprintf((char *)&src,"fdadd");
          break;
        case 0x67:
          sprintf((char *)&src,"fdmul");
          break;
        case 0x68:
          sprintf((char *)&src,"fssub");
          break;
        case 0x6c:
          sprintf((char *)&src,"fdsub");
        }
        if ((uVar1 & 0x4000) == 0) {
          sprintf(g_dasm_str,"%s.x   FP%d, FP%d",&src,(ulong)uVar2,(ulong)(uint)temp._28_4_);
        }
        else {
          pcVar4 = get_ea_mode_str(g_cpu_ir,2);
          sprintf(g_dasm_str,"%s%s %s, FP%d",&src,float_data_format[(ulong)uVar2 - 3] + 1,pcVar4,
                  (ulong)(uint)temp._28_4_);
        }
        break;
      default:
        sprintf(g_dasm_str,"FPU (?)");
        break;
      case 3:
        uVar2 = uVar1 >> 10 & 7;
        if (uVar2 == 3) {
          pcVar4 = get_ea_mode_str(g_cpu_ir,2);
          uVar2 = sext_7bit_int(uVar1 & 0x7f);
          sprintf(g_dasm_str,"fmove%s FP%d, %s {#%d}",
                  float_data_format[(ulong)(uVar1 >> 10 & 7) - 3] + 1,(ulong)uVar3,pcVar4,
                  (ulong)uVar2);
        }
        else if (uVar2 == 7) {
          pcVar4 = get_ea_mode_str(g_cpu_ir,2);
          sprintf(g_dasm_str,"fmove%s FP%d, %s {D%d}",
                  float_data_format[(ulong)(uVar1 >> 10 & 7) - 3] + 1,(ulong)uVar3,pcVar4,
                  (ulong)(uVar1 >> 4 & 7));
        }
        else {
          pcVar4 = get_ea_mode_str(g_cpu_ir,2);
          sprintf(g_dasm_str,"fmove%s FP%d, %s",float_data_format[(ulong)(uVar1 >> 10 & 7) - 3] + 1,
                  (ulong)uVar3,pcVar4);
        }
        break;
      case 4:
        pcVar4 = get_ea_mode_str(g_cpu_ir,2);
        sprintf(g_dasm_str,"fmovem.l   %s, ",pcVar4);
        if ((uVar1 & 0x1000) != 0) {
          strcat(g_dasm_str,"fpcr");
        }
        if ((uVar1 & 0x800) != 0) {
          strcat(g_dasm_str,"/fpsr");
        }
        if ((uVar1 & 0x400) != 0) {
          strcat(g_dasm_str,"/fpiar");
        }
        break;
      case 5:
        strcpy(g_dasm_str,"fmovem.l   ");
        if ((uVar1 & 0x1000) != 0) {
          strcat(g_dasm_str,"fpcr");
        }
        if ((uVar1 & 0x800) != 0) {
          strcat(g_dasm_str,"/fpsr");
        }
        if ((uVar1 & 0x400) != 0) {
          strcat(g_dasm_str,"/fpiar");
        }
        strcat(g_dasm_str,", ");
        pcVar4 = get_ea_mode_str(g_cpu_ir,2);
        strcat(g_dasm_str,pcVar4);
        break;
      case 6:
        if ((uVar1 >> 0xb & 1) == 0) {
          pcVar4 = get_ea_mode_str(g_cpu_ir,2);
          sprintf(g_dasm_str,"fmovem.x   %s, ",pcVar4);
          for (local_8c = 0; (int)local_8c < 8; local_8c = local_8c + 1) {
            if ((uVar1 & 1 << ((byte)local_8c & 0x1f)) != 0) {
              if ((uVar1 >> 0xc & 1) == 0) {
                sprintf(local_88,"FP%d ",(ulong)local_8c);
              }
              else {
                sprintf(local_88,"FP%d ",(ulong)(7 - local_8c));
              }
              strcat(g_dasm_str,local_88);
            }
          }
        }
        else {
          pcVar4 = get_ea_mode_str(g_cpu_ir,2);
          sprintf(g_dasm_str,"fmovem.x   %s, D%d",pcVar4,(ulong)(uVar1 >> 4 & 7));
        }
        break;
      case 7:
        if ((uVar1 >> 0xb & 1) == 0) {
          sprintf(g_dasm_str,"fmovem.x   ");
          for (local_bc = 0; (int)local_bc < 8; local_bc = local_bc + 1) {
            if ((uVar1 & 1 << ((byte)local_bc & 0x1f)) != 0) {
              if ((uVar1 >> 0xc & 1) == 0) {
                sprintf(local_b8,"FP%d ",(ulong)local_bc);
              }
              else {
                sprintf(local_b8,"FP%d ",(ulong)(7 - local_bc));
              }
              strcat(g_dasm_str,local_b8);
            }
          }
          strcat(g_dasm_str,", ");
          pcVar4 = get_ea_mode_str(g_cpu_ir,2);
          strcat(g_dasm_str,pcVar4);
        }
        else {
          pcVar4 = get_ea_mode_str(g_cpu_ir,2);
          sprintf(g_dasm_str,"fmovem.x   D%d, %s",(ulong)(uVar1 >> 4 & 7),pcVar4);
        }
      }
    }
  }
  return;
}

Assistant:

static void d68040_fpu(void)
{
	char float_data_format[8][3] =
	{
		".l", ".s", ".x", ".p", ".w", ".d", ".b", ".p"
	};

	char mnemonic[40];
	uint32 w2, src, dst_reg;
	LIMIT_CPU_TYPES(M68030_PLUS);
	w2 = read_imm_16();

	src = (w2 >> 10) & 0x7;
	dst_reg = (w2 >> 7) & 0x7;

	// special override for FMOVECR
	if ((((w2 >> 13) & 0x7) == 2) && (((w2>>10)&0x7) == 7))
	{
		sprintf(g_dasm_str, "fmovecr   #$%0x, fp%d", (w2&0x7f), dst_reg);
		return;
	}

	switch ((w2 >> 13) & 0x7)
	{
		case 0x0:
		case 0x2:
		{
			switch(w2 & 0x7f)
			{
				case 0x00:	sprintf(mnemonic, "fmove"); break;
				case 0x01:	sprintf(mnemonic, "fint"); break;
				case 0x02:	sprintf(mnemonic, "fsinh"); break;
				case 0x03:	sprintf(mnemonic, "fintrz"); break;
				case 0x04:	sprintf(mnemonic, "fsqrt"); break;
				case 0x06:	sprintf(mnemonic, "flognp1"); break;
				case 0x08:	sprintf(mnemonic, "fetoxm1"); break;
				case 0x09:	sprintf(mnemonic, "ftanh1"); break;
				case 0x0a:	sprintf(mnemonic, "fatan"); break;
				case 0x0c:	sprintf(mnemonic, "fasin"); break;
				case 0x0d:	sprintf(mnemonic, "fatanh"); break;
				case 0x0e:	sprintf(mnemonic, "fsin"); break;
				case 0x0f:	sprintf(mnemonic, "ftan"); break;
				case 0x10:	sprintf(mnemonic, "fetox"); break;
				case 0x11:	sprintf(mnemonic, "ftwotox"); break;
				case 0x12:	sprintf(mnemonic, "ftentox"); break;
				case 0x14:	sprintf(mnemonic, "flogn"); break;
				case 0x15:	sprintf(mnemonic, "flog10"); break;
				case 0x16:	sprintf(mnemonic, "flog2"); break;
				case 0x18:	sprintf(mnemonic, "fabs"); break;
				case 0x19:	sprintf(mnemonic, "fcosh"); break;
				case 0x1a:	sprintf(mnemonic, "fneg"); break;
				case 0x1c:	sprintf(mnemonic, "facos"); break;
				case 0x1d:	sprintf(mnemonic, "fcos"); break;
				case 0x1e:	sprintf(mnemonic, "fgetexp"); break;
				case 0x1f:	sprintf(mnemonic, "fgetman"); break;
				case 0x20:	sprintf(mnemonic, "fdiv"); break;
				case 0x21:	sprintf(mnemonic, "fmod"); break;
				case 0x22:	sprintf(mnemonic, "fadd"); break;
				case 0x23:	sprintf(mnemonic, "fmul"); break;
				case 0x24:	sprintf(mnemonic, "fsgldiv"); break;
				case 0x25:	sprintf(mnemonic, "frem"); break;
				case 0x26:	sprintf(mnemonic, "fscale"); break;
				case 0x27:	sprintf(mnemonic, "fsglmul"); break;
				case 0x28:	sprintf(mnemonic, "fsub"); break;
				case 0x30: case 0x31: case 0x32: case 0x33: case 0x34: case 0x35: case 0x36: case 0x37:
							sprintf(mnemonic, "fsincos"); break;
				case 0x38:	sprintf(mnemonic, "fcmp"); break;
				case 0x3a:	sprintf(mnemonic, "ftst"); break;
				case 0x41:	sprintf(mnemonic, "fssqrt"); break;
				case 0x45:	sprintf(mnemonic, "fdsqrt"); break;
				case 0x58:	sprintf(mnemonic, "fsabs"); break;
				case 0x5a:	sprintf(mnemonic, "fsneg"); break;
				case 0x5c:	sprintf(mnemonic, "fdabs"); break;
				case 0x5e:	sprintf(mnemonic, "fdneg"); break;
				case 0x60:	sprintf(mnemonic, "fsdiv"); break;
				case 0x62:	sprintf(mnemonic, "fsadd"); break;
				case 0x63:	sprintf(mnemonic, "fsmul"); break;
				case 0x64:	sprintf(mnemonic, "fddiv"); break;
				case 0x66:	sprintf(mnemonic, "fdadd"); break;
				case 0x67:	sprintf(mnemonic, "fdmul"); break;
				case 0x68:	sprintf(mnemonic, "fssub"); break;
				case 0x6c:	sprintf(mnemonic, "fdsub"); break;

				default:	sprintf(mnemonic, "FPU (?)"); break;
			}

			if (w2 & 0x4000)
			{
				sprintf(g_dasm_str, "%s%s %s, FP%d", mnemonic, float_data_format[src], get_ea_mode_str_32(g_cpu_ir), dst_reg);
			}
			else
			{
				sprintf(g_dasm_str, "%s.x   FP%d, FP%d", mnemonic, src, dst_reg);
			}
			break;
		}

		case 0x3:
		{
			switch ((w2>>10)&7)
			{
				case 3:		// packed decimal w/fixed k-factor
					sprintf(g_dasm_str, "fmove%s FP%d, %s {#%d}", float_data_format[(w2>>10)&7], dst_reg, get_ea_mode_str_32(g_cpu_ir), sext_7bit_int(w2&0x7f));
					break;

				case 7:		// packed decimal w/dynamic k-factor (register)
					sprintf(g_dasm_str, "fmove%s FP%d, %s {D%d}", float_data_format[(w2>>10)&7], dst_reg, get_ea_mode_str_32(g_cpu_ir), (w2>>4)&7);
					break;

				default:
					sprintf(g_dasm_str, "fmove%s FP%d, %s", float_data_format[(w2>>10)&7], dst_reg, get_ea_mode_str_32(g_cpu_ir));
					break;
			}
			break;
		}

		case 0x4:	// ea to control
		{
			sprintf(g_dasm_str, "fmovem.l   %s, ", get_ea_mode_str_32(g_cpu_ir));
			if (w2 & 0x1000) strcat(g_dasm_str, "fpcr");
			if (w2 & 0x0800) strcat(g_dasm_str, "/fpsr");
			if (w2 & 0x0400) strcat(g_dasm_str, "/fpiar");
			break;
		}

		case 0x5:	// control to ea
		{
			
			strcpy(g_dasm_str, "fmovem.l   ");
			if (w2 & 0x1000) strcat(g_dasm_str, "fpcr");
			if (w2 & 0x0800) strcat(g_dasm_str, "/fpsr");
			if (w2 & 0x0400) strcat(g_dasm_str, "/fpiar");
			strcat(g_dasm_str, ", ");
			strcat(g_dasm_str, get_ea_mode_str_32(g_cpu_ir));
			break;
		}

		case 0x6:	// memory to FPU, list
		{
			char temp[32];

			if ((w2>>11) & 1)	// dynamic register list
			{
				sprintf(g_dasm_str, "fmovem.x   %s, D%d", get_ea_mode_str_32(g_cpu_ir), (w2>>4)&7);
			}
			else	// static register list
			{
				int i;

				sprintf(g_dasm_str, "fmovem.x   %s, ", get_ea_mode_str_32(g_cpu_ir));

				for (i = 0; i < 8; i++)
				{
					if (w2 & (1<<i))
					{
						if ((w2>>12) & 1)	// postincrement or control
						{
							sprintf(temp, "FP%d ", 7-i);
						}
						else			// predecrement
						{
							sprintf(temp, "FP%d ", i);
						}
						strcat(g_dasm_str, temp);
					}
				}
			}
			break;
		}

		case 0x7:	// FPU to memory, list
		{
			char temp[32];

			if ((w2>>11) & 1)	// dynamic register list
			{
				sprintf(g_dasm_str, "fmovem.x   D%d, %s", (w2>>4)&7, get_ea_mode_str_32(g_cpu_ir));
			}
			else	// static register list
			{
				int i;

				sprintf(g_dasm_str, "fmovem.x   ");

				for (i = 0; i < 8; i++)
				{
					if (w2 & (1<<i))
					{
						if ((w2>>12) & 1)	// postincrement or control
						{
							sprintf(temp, "FP%d ", 7-i);
						}
						else			// predecrement
						{
							sprintf(temp, "FP%d ", i);
						}
						strcat(g_dasm_str, temp);
					}
				}

				strcat(g_dasm_str, ", ");
				strcat(g_dasm_str, get_ea_mode_str_32(g_cpu_ir));
			}
			break;
		}

		default:
		{
			sprintf(g_dasm_str, "FPU (?)");
			break;
		}
	}
}